

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

void open_history_file(void)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 local_310;
  FILE *f;
  char buf [512];
  char envr [256];
  
  pcVar2 = (char *)PHYSFS_getUserDir();
  strcpy(buf + 0x1f8,pcVar2);
  strcat(buf + 0x1f8,".testphys_history");
  iVar1 = access(buf + 0x1f8,0);
  if (iVar1 == 0) {
    local_310 = fopen(buf + 0x1f8,"r");
    if (local_310 == (FILE *)0x0) {
      printf("\n\nCould not open history file [%s] for reading!\n  Will not have past history available.\n\n"
             ,buf + 0x1f8);
      return;
    }
    do {
      pcVar2 = fgets((char *)&f,0x200,local_310);
      if (pcVar2 == (char *)0x0) break;
      sVar3 = strlen((char *)&f);
      if (*(char *)((long)&local_310 + sVar3 + 7) == '\n') {
        sVar3 = strlen((char *)&f);
        *(undefined1 *)((long)&local_310 + sVar3 + 7) = 0;
      }
      add_history(&f);
      iVar1 = feof(local_310);
    } while (iVar1 == 0);
    fclose(local_310);
  }
  history_file = (FILE *)fopen(buf + 0x1f8,"ab");
  if ((FILE *)history_file == (FILE *)0x0) {
    printf("\n\nCould not open history file [%s] for appending!\n  Will not be able to record this session\'s history.\n\n"
           ,buf + 0x1f8);
  }
  return;
}

Assistant:

static void open_history_file(void)
{
#if (defined PHYSFS_HAVE_READLINE)
#if 0
    const char *envr = getenv("TESTPHYSFS_HISTORY");
    if (!envr)
        return;
#else
    char envr[256];
    strcpy(envr, PHYSFS_getUserDir());
    strcat(envr, ".testphys_history");
#endif

    if (access(envr, F_OK) == 0)
    {
        char buf[512];
        FILE *f = fopen(envr, "r");
        if (!f)
        {
            printf("\n\n"
                   "Could not open history file [%s] for reading!\n"
                   "  Will not have past history available.\n\n",
                    envr);
            return;
        } /* if */

        do
        {
            if (fgets(buf, sizeof (buf), f) == NULL)
                break;

            if (buf[strlen(buf) - 1] == '\n')
                buf[strlen(buf) - 1] = '\0';
            add_history(buf);
        } while (!feof(f));

        fclose(f);
    } /* if */

    history_file = fopen(envr, "ab");
    if (!history_file)
    {
        printf("\n\n"
               "Could not open history file [%s] for appending!\n"
               "  Will not be able to record this session's history.\n\n",
                envr);
    } /* if */
#endif
}